

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  u8 uVar1;
  int iVar2;
  int iVar3;
  u32 uVar4;
  Pager *__dest;
  char *__s2;
  sqlite3_vfs *psVar5;
  sqlite3_mutex *psVar6;
  void *pvVar7;
  undefined8 *in_RCX;
  sqlite3 *in_RDX;
  char *in_RSI;
  sqlite3_vfs *in_RDI;
  uint in_R8D;
  uint in_R9D;
  bool bVar8;
  Btree *pSib;
  int i;
  sqlite3_mutex *mutexShared_1;
  Btree *pExisting;
  int iDb;
  sqlite3_mutex *mutexShared;
  char *zFullPathname;
  int nFullPathname;
  int nFilename;
  int isMemdb;
  int isTempDb;
  uchar zDbHeader [100];
  u8 nReserve;
  int rc;
  sqlite3_mutex *mutexOpen;
  Btree *p;
  BtShared *pBt;
  char *in_stack_fffffffffffffed8;
  code *szMmap;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  uint uVar9;
  Pager *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  bool bVar10;
  undefined1 uVar11;
  char cVar12;
  Pager *in_stack_ffffffffffffff00;
  Btree *pBVar13;
  int local_f4;
  int local_dc;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  byte in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff59;
  undefined2 in_stack_ffffffffffffff5a;
  byte bVar14;
  undefined4 in_stack_ffffffffffffff5c;
  Pager **in_stack_ffffffffffffff60;
  sqlite3_vfs *in_stack_ffffffffffffff68;
  u8 auStack_84 [4];
  _func_void_DbPage_ptr *in_stack_ffffffffffffff80;
  u8 auStack_78 [43];
  byte local_4d;
  int local_4c;
  sqlite3_mutex *local_48;
  Btree *local_40;
  BtShared *local_38;
  uint local_30;
  uint local_2c;
  undefined8 *local_28;
  sqlite3 *local_20;
  char *local_18;
  sqlite3_vfs *local_10;
  
  local_38 = (BtShared *)0x0;
  local_48 = (sqlite3_mutex *)0x0;
  local_4c = 0;
  cVar12 = true;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar8 = (bool)cVar12;
  if (in_RSI == (char *)0x0) {
LAB_00127ae9:
    if (bVar8 != false) {
      iVar2 = sqlite3TempInMemory(local_20);
      bVar10 = true;
      if (iVar2 != 0) goto LAB_00127b20;
    }
    bVar10 = (local_30 & 0x80) != 0;
  }
  else {
    bVar8 = *in_RSI == '\0';
    cVar12 = bVar8;
    iVar2 = strcmp(in_RSI,":memory:");
    bVar10 = true;
    if (iVar2 != 0) goto LAB_00127ae9;
  }
LAB_00127b20:
  if (bVar10 != false) {
    local_2c = local_2c | 2;
  }
  if (((local_30 & 0x100) != 0) && ((bVar10 != false || (bVar8 != false)))) {
    local_30 = local_30 & 0xfffffeff | 0x200;
  }
  uVar11 = bVar10;
  local_40 = (Btree *)sqlite3MallocZero(CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0
                                                ));
  if (local_40 == (Btree *)0x0) {
    return 7;
  }
  local_40->inTrans = '\0';
  local_40->db = local_20;
  (local_40->lock).pBtree = local_40;
  (local_40->lock).iTable = 1;
  if ((bVar8 == false) &&
     (((bVar10 == false || ((local_30 & 0x40) != 0)) && ((local_30 & 0x20000) != 0)))) {
    iVar2 = sqlite3Strlen30(local_18);
    iVar2 = iVar2 + 1;
    iVar3 = local_10->mxPathname + 1;
    in_stack_fffffffffffffef8 = iVar2;
    if (iVar2 < iVar3) {
      in_stack_fffffffffffffef8 = iVar3;
    }
    __dest = (Pager *)sqlite3Malloc(CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    local_40->sharable = '\x01';
    if (__dest == (Pager *)0x0) {
      sqlite3_free((void *)0x127c99);
      return 7;
    }
    if (bVar10 == false) {
      local_4c = sqlite3OsFullPathname
                           ((sqlite3_vfs *)in_stack_fffffffffffffef0,
                            (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            in_stack_fffffffffffffee4,in_stack_fffffffffffffed8);
      if (local_4c != 0) {
        sqlite3_free((void *)0x127d02);
        sqlite3_free((void *)0x127d0f);
        return local_4c;
      }
    }
    else {
      memcpy(__dest,local_18,(long)iVar2);
    }
    local_48 = sqlite3MutexAlloc((int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    sqlite3_mutex_enter((sqlite3_mutex *)0x127d43);
    sqlite3MutexAlloc((int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    sqlite3_mutex_enter((sqlite3_mutex *)0x127d5c);
    local_38 = sqlite3SharedCacheList;
LAB_00127d6b:
    if (local_38 != (BtShared *)0x0) {
      in_stack_fffffffffffffef0 = __dest;
      __s2 = sqlite3PagerFilename(local_38->pPager,0);
      iVar2 = strcmp((char *)in_stack_fffffffffffffef0,__s2);
      if ((iVar2 != 0) || (psVar5 = sqlite3PagerVfs(local_38->pPager), psVar5 != local_10))
      goto LAB_00127e9d;
      local_dc = local_20->nDb;
      while (local_dc = local_dc + -1, -1 < local_dc) {
        pBVar13 = local_20->aDb[local_dc].pBt;
        if ((pBVar13 != (Btree *)0x0) && (pBVar13->pBt == local_38)) {
          sqlite3_mutex_leave((sqlite3_mutex *)0x127e30);
          sqlite3_mutex_leave((sqlite3_mutex *)0x127e3d);
          sqlite3_free((void *)0x127e47);
          sqlite3_free((void *)0x127e54);
          return 0x13;
        }
      }
      local_40->pBt = local_38;
      local_38->nRef = local_38->nRef + 1;
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x127ec2);
    sqlite3_free((void *)0x127ecc);
  }
  iVar2 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if (local_38 == (BtShared *)0x0) {
    local_38 = (BtShared *)
               sqlite3MallocZero(CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (local_38 == (BtShared *)0x0) {
      local_4c = 7;
      goto LAB_0012841c;
    }
    szMmap = pageReinit;
    local_4c = sqlite3PagerOpen(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                (char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                 CONCAT22(in_stack_ffffffffffffff5a,
                                                          CONCAT11(in_stack_ffffffffffffff59,
                                                                   in_stack_ffffffffffffff58))),
                                in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                                in_stack_ffffffffffffff4c,in_stack_ffffffffffffff80);
    bVar14 = (byte)in_stack_ffffffffffffff5c;
    if (local_4c == 0) {
      sqlite3PagerSetMmapLimit
                ((Pager *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (sqlite3_int64)szMmap);
      local_4c = sqlite3PagerReadFileheader
                           (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                            (uchar *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
    iVar2 = (int)((ulong)szMmap >> 0x20);
    if (local_4c != 0) goto LAB_0012841c;
    local_38->openFlags = (u8)local_2c;
    local_38->db = local_20;
    local_4d = bVar14;
    sqlite3PagerSetBusyhandler
              (in_stack_fffffffffffffef0,
               (_func_int_void_ptr *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    local_40->pBt = local_38;
    local_38->pCursor = (BtCursor *)0x0;
    local_38->pPage1 = (MemPage *)0x0;
    uVar1 = sqlite3PagerIsreadonly(local_38->pPager);
    if (uVar1 != '\0') {
      local_38->btsFlags = local_38->btsFlags | 1;
    }
    local_38->pageSize =
         (uint)in_stack_ffffffffffffff58 << 8 | (uint)in_stack_ffffffffffffff59 << 0x10;
    if (((local_38->pageSize < 0x200) || (0x10000 < local_38->pageSize)) ||
       ((local_38->pageSize - 1 & local_38->pageSize) != 0)) {
      local_38->pageSize = 0;
      if ((local_18 != (char *)0x0) && (bVar10 == false)) {
        local_38->autoVacuum = '\0';
        local_38->incrVacuum = '\0';
      }
      local_4d = 0;
    }
    else {
      local_38->btsFlags = local_38->btsFlags | 2;
      uVar4 = sqlite3Get4byte(auStack_84);
      local_38->autoVacuum = uVar4 != 0;
      uVar4 = sqlite3Get4byte(auStack_78);
      local_38->incrVacuum = uVar4 != 0;
    }
    local_4c = sqlite3PagerSetPagesize
                         (in_stack_ffffffffffffff00,
                          (u32 *)CONCAT17(cVar12,CONCAT16(uVar11,CONCAT24(in_stack_fffffffffffffefc,
                                                                          in_stack_fffffffffffffef8)
                                                         )),
                          (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    if (local_4c != 0) goto LAB_0012841c;
    local_38->usableSize = local_38->pageSize - (uint)local_4d;
    if (local_40->sharable != '\0') {
      local_38->nRef = 1;
      sqlite3MutexAlloc(iVar2);
      if (sqlite3Config.bCoreMutex != 0) {
        psVar6 = sqlite3MutexAlloc(iVar2);
        local_38->mutex = psVar6;
        if (local_38->mutex == (sqlite3_mutex *)0x0) {
          local_4c = 7;
          local_20->mallocFailed = '\0';
          goto LAB_0012841c;
        }
      }
      sqlite3_mutex_enter((sqlite3_mutex *)0x128241);
      local_38->pNext = sqlite3SharedCacheList;
      sqlite3SharedCacheList = local_38;
      sqlite3_mutex_leave((sqlite3_mutex *)0x12826d);
    }
  }
  if (local_40->sharable != '\0') {
    for (local_f4 = 0; local_f4 < local_20->nDb; local_f4 = local_f4 + 1) {
      pBVar13 = local_20->aDb[local_f4].pBt;
      if ((pBVar13 != (Btree *)0x0) && (pBVar13->sharable != '\0')) goto LAB_001282dd;
    }
  }
  goto LAB_00128409;
LAB_00127e9d:
  local_38 = local_38->pNext;
  goto LAB_00127d6b;
LAB_001282dd:
  for (; pBVar13->pPrev != (Btree *)0x0; pBVar13 = pBVar13->pPrev) {
  }
  if (local_40->pBt < pBVar13->pBt) {
    local_40->pNext = pBVar13;
    local_40->pPrev = (Btree *)0x0;
    pBVar13->pPrev = local_40;
  }
  else {
    while( true ) {
      uVar9 = in_stack_fffffffffffffeec & 0xffffff;
      if (pBVar13->pNext != (Btree *)0x0) {
        uVar9 = CONCAT13(pBVar13->pNext->pBt < local_40->pBt,(int3)in_stack_fffffffffffffeec);
      }
      in_stack_fffffffffffffeec = uVar9;
      if ((char)(uVar9 >> 0x18) == '\0') break;
      pBVar13 = pBVar13->pNext;
    }
    local_40->pNext = pBVar13->pNext;
    local_40->pPrev = pBVar13;
    if (local_40->pNext != (Btree *)0x0) {
      local_40->pNext->pPrev = local_40;
    }
    pBVar13->pNext = local_40;
  }
LAB_00128409:
  *local_28 = local_40;
LAB_0012841c:
  if (local_4c == 0) {
    pvVar7 = sqlite3BtreeSchema((Btree *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                                (_func_void_void_ptr *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (pvVar7 == (void *)0x0) {
      sqlite3PagerSetCachesize
                ((Pager *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),iVar2);
    }
  }
  else {
    if ((local_38 != (BtShared *)0x0) && (local_38->pPager != (Pager *)0x0)) {
      sqlite3PagerClose((Pager *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
    sqlite3_free((void *)0x12845c);
    sqlite3_free((void *)0x128469);
    *local_28 = 0;
  }
  if (local_48 != (sqlite3_mutex *)0x0) {
    sqlite3_mutex_leave((sqlite3_mutex *)0x1284c6);
  }
  return local_4c;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          EXTRA_SIZE, flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#ifdef SQLITE_SECURE_DELETE
    pBt->btsFlags |= BTS_SECURE_DELETE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      pBt->nRef = 1;
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM;
          db->mallocFailed = 0;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( p->pBt<pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && pSib->pNext->pBt<p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  return rc;
}